

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

Var Js::JavascriptRegExp::CallExec
              (RecyclableObject *thisObj,JavascriptString *string,PCWSTR varName,
              ScriptContext *scriptContext)

{
  anon_class_32_4_07ff6b3c implicitCall;
  bool bVar1;
  BOOL BVar2;
  Var aValue;
  RecyclableObject *function;
  ThreadContext *this;
  JavascriptRegExp *regularExpression;
  JavascriptRegExp *regExObj;
  Var result;
  ThreadContext *threadContext;
  RecyclableObject *execFn;
  Var exec;
  ScriptContext *scriptContext_local;
  PCWSTR varName_local;
  JavascriptString *string_local;
  RecyclableObject *thisObj_local;
  
  aValue = Js::JavascriptOperators::GetProperty(thisObj,0x83,scriptContext,(PropertyValueInfo *)0x0)
  ;
  bVar1 = JavascriptConversion::IsCallable(aValue);
  if (bVar1) {
    function = UnsafeVarTo<Js::RecyclableObject>(aValue);
    this = ScriptContext::GetThreadContext(scriptContext);
    implicitCall.execFn = function;
    implicitCall.scriptContext = scriptContext;
    implicitCall.thisObj = thisObj;
    implicitCall.string = string;
    thisObj_local =
         (RecyclableObject *)
         ThreadContext::
         ExecuteImplicitCall<Js::JavascriptRegExp::CallExec(Js::RecyclableObject*,Js::JavascriptString*,char16_t_const*,Js::ScriptContext*)::__0>
                   (this,function,ImplicitCall_Accessor,implicitCall);
    BVar2 = Js::JavascriptOperators::IsObjectOrNull(thisObj_local);
    if (BVar2 == 0) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e9f7,varName);
    }
  }
  else {
    regularExpression = ToRegExp(thisObj,varName,scriptContext);
    thisObj_local =
         (RecyclableObject *)
         RegexHelper::RegexExec(scriptContext,regularExpression,string,false,(void *)0x0);
  }
  return thisObj_local;
}

Assistant:

Var JavascriptRegExp::CallExec(RecyclableObject* thisObj, JavascriptString* string, PCWSTR varName, ScriptContext* scriptContext)
    {
        Var exec = JavascriptOperators::GetProperty(thisObj, PropertyIds::exec, scriptContext);
        if (JavascriptConversion::IsCallable(exec))
        {
            RecyclableObject* execFn = UnsafeVarTo<RecyclableObject>(exec);
            ThreadContext * threadContext = scriptContext->GetThreadContext();
            Var result = threadContext->ExecuteImplicitCall(execFn, ImplicitCall_Accessor, [=]()->Js::Var
            {
                return CALL_FUNCTION(scriptContext->GetThreadContext(), execFn, CallInfo(CallFlags_Value, 2), thisObj, string);
            });

            if (!JavascriptOperators::IsObjectOrNull(result))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_RegExpExecInvalidReturnType, varName);
            }

            return result;
        }

        JavascriptRegExp* regExObj = ToRegExp(thisObj, varName, scriptContext);
        return RegexHelper::RegexExec(scriptContext, regExObj, string, false);
    }